

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O0

void __thiscall Client::requestAccessToken(Client *this)

{
  undefined1 uVar1;
  Response *pRVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar3;
  long in_RDI;
  Json resultJson;
  Result result;
  string data;
  nullptr_t in_stack_fffffffffffffc78;
  string *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  string *in_stack_fffffffffffffc90;
  Client *in_stack_fffffffffffffc98;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  char (*in_stack_fffffffffffffcd8) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  allocator<char> *t1;
  int local_2dc;
  duration<long,std::ratio<1l,1l>> local_2d8 [4];
  Error in_stack_fffffffffffffd2c;
  unsigned_long local_2c8;
  duration<long,std::ratio<1l,1l>> local_2c0 [8];
  duration local_2b8;
  duration local_2b0;
  string local_2a8 [80];
  string local_258 [6];
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  parser_callback_t *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  allocator<char> local_231;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  Result local_100;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [40];
  
  spdlog::info<char[28]>((char (*) [28])0x11d02b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (char *)in_stack_fffffffffffffcb8,(allocator<char> *)in_stack_fffffffffffffcb0);
  std::allocator<char>::~allocator(&local_29);
  s_abi_cxx11_((char *)in_stack_fffffffffffffcb8,(size_t)in_stack_fffffffffffffcb0);
  std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
  std::__cxx11::string::operator+=(local_28,local_60);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  s_abi_cxx11_((char *)in_stack_fffffffffffffcb8,(size_t)in_stack_fffffffffffffcb0);
  std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
  std::__cxx11::string::operator+=(local_28,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (char *)in_stack_fffffffffffffcb8,(allocator<char> *)in_stack_fffffffffffffcb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (char *)in_stack_fffffffffffffcb8,(allocator<char> *)in_stack_fffffffffffffcb0);
  httplib::Client::Post
            (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffc80);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  uVar1 = httplib::Result::operator_cast_to_bool((Result *)0x11d229);
  httplib::Result::error(&local_100);
  httplib::to_string_abi_cxx11_(in_stack_fffffffffffffd2c);
  t1 = &local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (char *)in_stack_fffffffffffffcb8,(allocator<char> *)in_stack_fffffffffffffcb0);
  std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
  std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
  std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
  std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
  std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            ((bool)uVar1,(char (*) [14])t1,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string(local_170);
  pRVar2 = httplib::Result::operator->((Result *)0x11d3de);
  uVar1 = pRVar2->status == 200;
  httplib::Result::operator->((Result *)0x11d406);
  check<std::__cxx11::string_const&>((bool)uVar1,in_stack_fffffffffffffcc8);
  pRVar2 = httplib::Result::operator->((Result *)0x11d434);
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::function((function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
              *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string_const&>
            (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,(bool)in_stack_fffffffffffffdaf,
             (bool)in_stack_fffffffffffffdae);
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function((function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
               *)0x11d493);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(uVar1,in_stack_fffffffffffffcd0),(char *)pRVar2);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::get<std::__cxx11::string,std::__cxx11::string>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffc88);
  this_00 = local_2a8;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x20),this_00);
  std::__cxx11::string::~string(this_00);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(uVar1,in_stack_fffffffffffffcd0),(char *)pRVar2);
  local_2c8 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::get<unsigned_long,unsigned_long>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffc80);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>(local_2c0,&local_2c8);
  std::chrono::_V2::system_clock::now();
  tVar3 = std::chrono::operator+
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffc88,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffc80);
  local_2dc = 10;
  local_2b8 = tVar3.__d.__r;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_2d8,&local_2dc);
  tVar3 = std::chrono::operator-
                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)tVar3.__d.__r,
                     (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffc80);
  ((duration *)(in_RDI + 0x40))->__r = (rep)tVar3.__d.__r;
  local_2b0 = tVar3.__d.__r;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)tVar3.__d.__r);
  httplib::Result::~Result((Result *)tVar3.__d.__r);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void requestAccessToken() {
        spdlog::info("Requesting new access token");

        std::string data = "grant_type=password";
        data += "&username="s + bot_name;
        data += "&password="s + bot_password;

        const httplib::Result result = tokenClient.Post("/api/v1/access_token", data, "application/x-www-form-urlencoded");
        check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
        check(result->status == 200, result->reason);

        const Json resultJson = Json::parse(result->body);

        accessToken = resultJson["access_token"].get<std::string>();
        accessTokenExpiration = std::chrono::seconds(resultJson["expires_in"].get<size_t>()) + Clock::now() - std::chrono::seconds(10);
    }